

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QMap<int,_QVariant>_>::reallocate
          (QMovableArrayOps<QMap<int,_QVariant>_> *this,qsizetype alloc,AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  
  pVar1 = QArrayData::reallocateUnaligned
                    (&((this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
                       super_QArrayDataPointer<QMap<int,_QVariant>_>.d)->super_QArrayData,
                     (this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
                     super_QArrayDataPointer<QMap<int,_QVariant>_>.ptr,8,alloc,option);
  if (pVar1.second != (void *)0x0) {
    (this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
    super_QArrayDataPointer<QMap<int,_QVariant>_>.d = (Data *)pVar1.first;
    (this->super_QGenericArrayOps<QMap<int,_QVariant>_>).
    super_QArrayDataPointer<QMap<int,_QVariant>_>.ptr = (QMap<int,_QVariant> *)pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }